

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

void test_ecc_weierstrass_add(void)

{
  WeierstrassCurve *wc;
  WeierstrassPoint *wp;
  WeierstrassPoint *wp_00;
  size_t sVar1;
  WeierstrassPoint *pWVar2;
  WeierstrassPoint *src;
  size_t j;
  ulong index;
  ulong index_00;
  
  wc = wcurve();
  wp = ecc_weierstrass_point_new_identity(wc);
  wp_00 = ecc_weierstrass_point_new_identity(wc);
  index_00 = 0;
  while( true ) {
    sVar1 = (*looplimit)(5);
    if (sVar1 <= index_00) break;
    index = 0;
    while( true ) {
      sVar1 = (*looplimit)(5);
      if (sVar1 <= index) break;
      if ((((index_00 != 0) && (index != 0)) && (index_00 != index)) &&
         ((index != 4 || index_00 != 3 && (index != 3 || index_00 != 4)))) {
        pWVar2 = wpoint(wc,index_00);
        src = wpoint(wc,index);
        ecc_weierstrass_point_copy_into(wp,pWVar2);
        ecc_weierstrass_point_copy_into(wp_00,src);
        ecc_weierstrass_point_free(pWVar2);
        ecc_weierstrass_point_free(src);
        log_start();
        pWVar2 = ecc_weierstrass_add(wp,wp_00);
        log_end();
        ecc_weierstrass_point_free(pWVar2);
      }
      index = index + 1;
    }
    index_00 = index_00 + 1;
  }
  ecc_weierstrass_point_free(wp);
  ecc_weierstrass_point_free(wp_00);
  ecc_weierstrass_curve_free(wc);
  return;
}

Assistant:

static void test_ecc_weierstrass_add(void)
{
    WeierstrassCurve *wc = wcurve();
    WeierstrassPoint *a = ecc_weierstrass_point_new_identity(wc);
    WeierstrassPoint *b = ecc_weierstrass_point_new_identity(wc);
    for (size_t i = 0; i < looplimit(5); i++) {
        for (size_t j = 0; j < looplimit(5); j++) {
            if (i == 0 || j == 0 || i == j ||
                (i==3 && j==4) || (i==4 && j==3))
                continue;              /* difficult cases */

            WeierstrassPoint *A = wpoint(wc, i), *B = wpoint(wc, j);
            ecc_weierstrass_point_copy_into(a, A);
            ecc_weierstrass_point_copy_into(b, B);
            ecc_weierstrass_point_free(A);
            ecc_weierstrass_point_free(B);

            log_start();
            WeierstrassPoint *r = ecc_weierstrass_add(a, b);
            log_end();
            ecc_weierstrass_point_free(r);
        }
    }
    ecc_weierstrass_point_free(a);
    ecc_weierstrass_point_free(b);
    ecc_weierstrass_curve_free(wc);
}